

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * GenImageGradientV(Image *__return_storage_ptr__,int width,int height,Color top,Color bottom)

{
  void *pvVar1;
  float fVar2;
  int local_2c;
  int i;
  float factor;
  int j;
  Color *pixels;
  int height_local;
  int width_local;
  Color bottom_local;
  Color top_local;
  
  pvVar1 = malloc((long)(width * height) << 2);
  for (i = 0; i < height; i = i + 1) {
    fVar2 = (float)i / (float)height;
    for (local_2c = 0; local_2c < width; local_2c = local_2c + 1) {
      *(char *)((long)pvVar1 + (long)(i * width + local_2c) * 4) =
           (char)(int)((float)((uint)bottom & 0xff) * fVar2 +
                      (float)((uint)top & 0xff) * (1.0 - fVar2));
      *(char *)((long)pvVar1 + (long)(i * width + local_2c) * 4 + 1) =
           (char)(int)((float)((uint)bottom >> 8 & 0xff) * fVar2 +
                      (float)((uint)top >> 8 & 0xff) * (1.0 - fVar2));
      *(char *)((long)pvVar1 + (long)(i * width + local_2c) * 4 + 2) =
           (char)(int)((float)((uint)bottom >> 0x10 & 0xff) * fVar2 +
                      (float)((uint)top >> 0x10 & 0xff) * (1.0 - fVar2));
      *(char *)((long)pvVar1 + (long)(i * width + local_2c) * 4 + 3) =
           (char)(int)((float)((uint)bottom >> 0x18) * fVar2 +
                      (float)((uint)top >> 0x18) * (1.0 - fVar2));
    }
  }
  __return_storage_ptr__->data = pvVar1;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientV(int width, int height, Color top, Color bottom)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int j = 0; j < height; j++)
    {
        float factor = (float)j/(float)height;
        for (int i = 0; i < width; i++)
        {
            pixels[j*width + i].r = (int)((float)bottom.r*factor + (float)top.r*(1.f - factor));
            pixels[j*width + i].g = (int)((float)bottom.g*factor + (float)top.g*(1.f - factor));
            pixels[j*width + i].b = (int)((float)bottom.b*factor + (float)top.b*(1.f - factor));
            pixels[j*width + i].a = (int)((float)bottom.a*factor + (float)top.a*(1.f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}